

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  ArrayIndex AVar1;
  runtime_error *this_00;
  ArrayIndex AVar2;
  CZString local_60;
  Value local_50;
  
  if (this->field_0x8 == '\0') {
    Value(&local_50,arrayValue);
    swap(this,&local_50);
    ~Value(&local_50);
  }
  else if (this->field_0x8 != '\x06') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"in Json::Value::resize(): requires arrayValue");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  AVar1 = size(this);
  if (newSize == 0) {
    clear(this);
    return;
  }
  if (AVar1 < newSize) {
    operator[](this,newSize - 1);
    return;
  }
  for (AVar2 = newSize; AVar1 != AVar2; AVar2 = AVar2 + 1) {
    local_60.cstr_ = (char *)0x0;
    local_60.index_ = AVar2;
    std::
    _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::erase(&((this->value_).map_)->_M_t,&local_60);
    CZString::~CZString(&local_60);
  }
  AVar1 = size(this);
  if (AVar1 == newSize) {
    return;
  }
  __assert_fail("size() == newSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                ,0x345,"void Json::Value::resize(ArrayIndex)");
}

Assistant:

void Value::resize(ArrayIndex newSize) {
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == arrayValue,
                      "in Json::Value::resize(): requires arrayValue");
  if (type_ == nullValue)
    *this = Value(arrayValue);
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  ArrayIndex oldSize = size();
  if (newSize == 0)
    clear();
  else if (newSize > oldSize)
    (*this)[newSize - 1];
  else {
    for (ArrayIndex index = newSize; index < oldSize; ++index) {
      value_.map_->erase(index);
    }
    assert(size() == newSize);
  }
#else
  value_.array_->resize(newSize);
#endif
}